

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall TasGrid::GridGlobal::proposeUpdatedTensors(GridGlobal *this)

{
  MultiIndexSet *this_00;
  bool bVar1;
  int max_level;
  MultiIndexSet MStack_128;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  OneDimensionalWrapper local_e0;
  
  this_00 = &this->updated_tensors;
  max_level = MultiIndexSet::getMaxIndex(this_00);
  OneDimensionalWrapper::OneDimensionalWrapper
            (&local_e0,&this->custom,max_level,this->rule,this->alpha,this->beta);
  OneDimensionalWrapper::operator=(&this->wrapper,&local_e0);
  OneDimensionalWrapper::~OneDimensionalWrapper(&local_e0);
  MultiIndexManipulations::computeActiveTensorsWeights
            (this_00,&this->updated_active_tensors,&this->updated_active_w);
  bVar1 = OneDimensionalMeta::isNonNested(this->rule);
  if (bVar1) {
    MultiIndexManipulations::generateNonNestedPoints
              (&MStack_128,&this->updated_active_tensors,&this->wrapper);
  }
  else {
    local_100._8_8_ = 0;
    local_e8 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:193:80)>
               ::_M_invoke;
    local_f0 = ::std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:193:80)>
               ::_M_manager;
    local_100._M_unused._M_object = this;
    MultiIndexManipulations::generateNestedPoints
              (&MStack_128,this_00,(function<int_(int)> *)&local_100);
  }
  MultiIndexSet::operator-
            ((MultiIndexSet *)&local_e0,&MStack_128,&(this->super_BaseCanonicalGrid).points);
  MultiIndexSet::operator=(&(this->super_BaseCanonicalGrid).needed,(MultiIndexSet *)&local_e0);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_e0.num_points.super__Vector_base<int,_std::allocator<int>_>);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&MStack_128.indexes.super__Vector_base<int,_std::allocator<int>_>);
  if (!bVar1) {
    ::std::_Function_base::~_Function_base((_Function_base *)&local_100);
  }
  return;
}

Assistant:

void GridGlobal::proposeUpdatedTensors(){
    wrapper = OneDimensionalWrapper(custom, updated_tensors.getMaxIndex(), rule, alpha, beta);

    MultiIndexManipulations::computeActiveTensorsWeights(updated_tensors, updated_active_tensors, updated_active_w);

    // the new needed points are the points associated with the updated_active_tensors without the existing set of loaded points
    needed = ((OneDimensionalMeta::isNonNested(rule)) ?
                MultiIndexManipulations::generateNonNestedPoints(updated_active_tensors, wrapper) :
                MultiIndexManipulations::generateNestedPoints(updated_tensors, [&](int l) -> int{ return wrapper.getNumPoints(l); }))
             - points;
}